

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi_io.c
# Opt level: O0

int kvtree_read_scatter_map
              (char *prefix,int depth,int *ptr_valid,char **ptr_file,unsigned_long *ptr_offset,
              MPI_Comm comm)

{
  int iVar1;
  int local_4bc;
  char local_4b8 [4];
  int level_id;
  char mappath [1024];
  char *local_b0;
  char *value;
  kvtree *elem_hash;
  kvtree_elem *elem;
  unsigned_long newoffset;
  char *newfile;
  kvtree *pkStack_80;
  int newvalid;
  kvtree *rank_hash;
  kvtree *recv;
  kvtree *send;
  ssize_t read_rc;
  kvtree *pkStack_58;
  int fd;
  kvtree *hash;
  unsigned_long offset;
  char *file;
  int valid;
  int rc;
  MPI_Comm comm_local;
  unsigned_long *ptr_offset_local;
  char **ptr_file_local;
  int *ptr_valid_local;
  char *pcStack_10;
  int depth_local;
  char *prefix_local;
  
  file._4_4_ = 0;
  file._0_4_ = *ptr_valid;
  offset = (unsigned_long)*ptr_file;
  hash = (kvtree *)*ptr_offset;
  _valid = comm;
  comm_local = (MPI_Comm)ptr_offset;
  ptr_offset_local = (unsigned_long *)ptr_file;
  ptr_file_local = (char **)ptr_valid;
  ptr_valid_local._4_4_ = depth;
  pcStack_10 = prefix;
  pkStack_58 = kvtree_new();
  if ((int)file != 0) {
    read_rc._4_4_ = kvtree_open((char *)offset,0);
    if (read_rc._4_4_ < 0) {
      kvtree_err("Failed to open file %s @ %s:%d",offset,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi_io.c"
                );
      file._4_4_ = 1;
    }
    else {
      kvtree_lseek((char *)offset,read_rc._4_4_,(off_t)hash,0);
      send = (kvtree *)kvtree_read_fd((char *)offset,read_rc._4_4_,pkStack_58);
      if ((long)send < 0) {
        kvtree_err("Failed to read from %s @ %s:%d",offset,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi_io.c"
                  );
        file._4_4_ = 1;
      }
      kvtree_close((char *)offset,read_rc._4_4_);
    }
  }
  iVar1 = kvtree_alltrue((uint)(file._4_4_ == 0),_valid);
  if (iVar1 == 0) {
    file._4_4_ = 1;
  }
  else {
    recv = kvtree_new();
    rank_hash = kvtree_new();
    if ((int)file != 0) {
      pkStack_80 = kvtree_get(pkStack_58,"RANK");
      kvtree_merge(recv,pkStack_80);
    }
    kvtree_exchange_direction(recv,rank_hash,_valid,KVTREE_EXCHANGE_RIGHT);
    newfile._4_4_ = 0;
    newoffset = 0;
    elem = (kvtree_elem *)0x0;
    elem_hash = (kvtree *)kvtree_elem_first(rank_hash);
    if ((kvtree_elem *)elem_hash != (kvtree_elem *)0x0) {
      newfile._4_4_ = 1;
      value = (char *)kvtree_elem_hash((kvtree_elem *)elem_hash);
      iVar1 = kvtree_util_get_str((kvtree *)value,"FILE",&local_b0);
      if (iVar1 == 0) {
        snprintf(local_4b8,0x400,"%s%s",pcStack_10,local_b0);
        newoffset = (unsigned_long)strdup(local_4b8);
      }
      else {
        file._4_4_ = 1;
      }
      iVar1 = kvtree_util_get_bytecount((kvtree *)value,"OFFSET",(unsigned_long *)&elem);
      if (iVar1 != 0) {
        file._4_4_ = 1;
      }
    }
    kvtree_delete(&rank_hash);
    kvtree_delete(&recv);
    local_4bc = -1;
    if (((int)file != 0) && (iVar1 = kvtree_util_get_int(pkStack_58,"LEVEL",&local_4bc), iVar1 != 0)
       ) {
      file._4_4_ = 1;
    }
    MPI_Bcast(&local_4bc,1,&ompi_mpi_int,0,_valid);
    iVar1 = kvtree_alltrue((uint)(file._4_4_ == 0),_valid);
    if (iVar1 == 0) {
      file._4_4_ = 1;
    }
    else {
      if ((int)file != 0) {
        kvtree_free(ptr_offset_local);
      }
      *(undefined4 *)ptr_file_local = newfile._4_4_;
      *ptr_offset_local = newoffset;
      *(kvtree_elem **)comm_local = elem;
      if (1 < local_4bc) {
        file._4_4_ = kvtree_read_scatter_map
                               (pcStack_10,ptr_valid_local._4_4_ + 1,(int *)ptr_file_local,
                                (char **)ptr_offset_local,(unsigned_long *)comm_local,_valid);
      }
    }
  }
  kvtree_delete(&stack0xffffffffffffffa8);
  return file._4_4_;
}

Assistant:

static int kvtree_read_scatter_map(
  const char*     prefix,
  int             depth,
  int*            ptr_valid,
  char**          ptr_file,
  unsigned long*  ptr_offset,
  MPI_Comm        comm)
{
  int rc = KVTREE_SUCCESS;

  /* get local variables so we don't have to deference everything */
  int valid            = *ptr_valid;
  char* file           = *ptr_file;
  unsigned long offset = *ptr_offset;

  /* create a hash to hold section of file */
  kvtree* hash = kvtree_new();

  /* if we can read from file do it */
  if (valid) {
    /* open file if we haven't already */
    int fd = kvtree_open(file, O_RDONLY);
    if (fd >= 0) {
      /* read our segment from the file */
      kvtree_lseek(file, fd, offset, SEEK_SET);
      ssize_t read_rc = kvtree_read_fd(file, fd, hash);
      if (read_rc < 0) {
        kvtree_err("Failed to read from %s @ %s:%d",
          file, __FILE__, __LINE__
        );
        rc = KVTREE_FAILURE;
      }

      /* close the file */
      kvtree_close(file, fd);
    } else {
      kvtree_err("Failed to open file %s @ %s:%d",
        file, __FILE__, __LINE__
      );
      rc = KVTREE_FAILURE;
    }
  }

  /* check for read errors */
  if (! kvtree_alltrue(rc == KVTREE_SUCCESS, comm)) {
    rc = KVTREE_FAILURE;
    goto cleanup;
  }

  /* create hashes to exchange data */
  kvtree* send = kvtree_new();
  kvtree* recv = kvtree_new();

  /* copy rank data into send hash */
  if (valid) {
    kvtree* rank_hash = kvtree_get(hash, "RANK");
    kvtree_merge(send, rank_hash);
  }

  /* exchange hashes */
  kvtree_exchange_direction(send, recv, comm, KVTREE_EXCHANGE_RIGHT);

  /* see if anyone sent us anything */
  int newvalid = 0;
  char* newfile = NULL;
  unsigned long newoffset = 0;
  kvtree_elem* elem = kvtree_elem_first(recv);
  if (elem != NULL) {
    /* got something, so now we'll read in the next step */
    newvalid = 1;

    /* get file name we should read */
    kvtree* elem_hash = kvtree_elem_hash(elem);
    char* value;
    if (kvtree_util_get_str(elem_hash, "FILE", &value) == KVTREE_SUCCESS)
    {
      /* return string of full path to file to caller */
      char mappath[1024];
      snprintf(mappath, sizeof(mappath), "%s%s", prefix, value);
      newfile = strdup(mappath);
    } else {
      rc = KVTREE_FAILURE;
    }

    /* get offset we should start reading from */
    if (kvtree_util_get_bytecount(elem_hash, "OFFSET", &newoffset) != KVTREE_SUCCESS)
    {
      rc = KVTREE_FAILURE;
    }
  }

  /* free the send and receive hashes */
  kvtree_delete(&recv);
  kvtree_delete(&send);

  /* get level id, and broadcast it from rank 0,
   * which we assume to be a reader in all steps */
  int level_id = -1;
  if (valid) {
    if (kvtree_util_get_int(hash, "LEVEL", &level_id) != KVTREE_SUCCESS)
    {
      rc = KVTREE_FAILURE;
    }
  }
  MPI_Bcast(&level_id, 1, MPI_INT, 0, comm);

  /* check for read errors */
  if (! kvtree_alltrue(rc == KVTREE_SUCCESS, comm)) {
    rc = KVTREE_FAILURE;
    goto cleanup;
  }

  /* set parameters for output or next iteration,
   * we already took care of updating ptr_fd earlier */
  if (valid) {
    kvtree_free(ptr_file);
  }
  *ptr_valid  = newvalid;
  *ptr_file   = newfile;
  *ptr_offset = newoffset;

  /* recurse if we still have levels to read */
  if (level_id > 1) {
    rc = kvtree_read_scatter_map(prefix, depth+1, ptr_valid, ptr_file, ptr_offset, comm);
  }

cleanup:
  /* free the hash */
  kvtree_delete(&hash);

  return rc;
}